

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<WadStuff,_WadStuff>::DoDelete(TArray<WadStuff,_WadStuff> *this,uint first,uint last)

{
  uint local_1c;
  uint i;
  uint last_local;
  uint first_local;
  TArray<WadStuff,_WadStuff> *this_local;
  
  local_1c = first;
  if (last == 0xffffffff) {
    __assert_fail("last != ~0u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                  ,0x1ad,
                  "void TArray<WadStuff>::DoDelete(unsigned int, unsigned int) [T = WadStuff, TT = WadStuff]"
                 );
  }
  for (; local_1c <= last; local_1c = local_1c + 1) {
    WadStuff::~WadStuff(this->Array + local_1c);
  }
  return;
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}